

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O2

void nn_btcp_destroy(nn_epbase *self)

{
  nn_fsm *self_00;
  
  self_00 = (nn_fsm *)(self + -6);
  if (self == (nn_epbase *)0x0) {
    self_00 = (nn_fsm *)0x0;
  }
  if (*(uint *)&self_00[1].fn == 1) {
    nn_list_term((nn_list *)&self_00[8].ctx);
    if (self_00[8].owner == (nn_fsm *)0x0) {
      nn_usock_term((nn_usock *)&self_00[1].srcptr);
      nn_backoff_term((nn_backoff *)&self_00[8].stopped.src);
      nn_epbase_term((nn_epbase *)&self_00[1].shutdown_fn);
      nn_fsm_term(self_00);
      nn_free(self_00);
      return;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","btcp->atcp == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
            ,0xca);
  }
  else {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)&self_00[1].fn,
            "NN_BTCP_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
            ,200);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_btcp_destroy (struct nn_epbase *self)
{
    struct nn_btcp *btcp;

    btcp = nn_cont (self, struct nn_btcp, epbase);

    nn_assert_state (btcp, NN_BTCP_STATE_IDLE);
    nn_list_term (&btcp->atcps);
    nn_assert (btcp->atcp == NULL);
    nn_usock_term (&btcp->usock);
    nn_backoff_term (&btcp->retry);
    nn_epbase_term (&btcp->epbase);
    nn_fsm_term (&btcp->fsm);

    nn_free (btcp);
}